

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* minja::split(string *s,string *sep)

{
  long lVar1;
  ulong in_RDX;
  string *in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  size_t end;
  size_t start;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *result;
  value_type *in_stack_ffffffffffffff68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  string local_50 [32];
  value_type *local_30;
  _Alloc_hider *local_28;
  undefined1 local_19;
  ulong local_18;
  string *local_10;
  
  local_19 = 0;
  this = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x27d406);
  local_28 = (_Alloc_hider *)0x0;
  local_30 = (value_type *)std::__cxx11::string::find(local_10,local_18);
  while (local_30 != (value_type *)0xffffffffffffffff) {
    std::__cxx11::string::substr((ulong)local_50,(ulong)local_10);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(this,in_stack_ffffffffffffff68);
    std::__cxx11::string::~string(local_50);
    in_stack_ffffffffffffff68 = local_30;
    lVar1 = std::__cxx11::string::length();
    local_28 = &in_stack_ffffffffffffff68->_M_dataplus + lVar1;
    local_30 = (value_type *)std::__cxx11::string::find(local_10,local_18);
  }
  std::__cxx11::string::substr((ulong)&stack0xffffffffffffff80,(ulong)local_10);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this,in_stack_ffffffffffffff68);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  return in_RDI;
}

Assistant:

static std::vector<std::string> split(const std::string & s, const std::string & sep) {
  std::vector<std::string> result;
  size_t start = 0;
  size_t end = s.find(sep);
  while (end != std::string::npos) {
    result.push_back(s.substr(start, end - start));
    start = end + sep.length();
    end = s.find(sep, start);
  }
  result.push_back(s.substr(start));
  return result;
}